

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thrdd.c
# Opt level: O3

uint getaddrinfo_thread(void *arg)

{
  int iVar1;
  int *piVar2;
  ssize_t sVar3;
  char service [12];
  char local_24 [12];
  
  curl_msnprintf(local_24,0xc,"%d",(ulong)*(uint *)((long)arg + 0x94));
  iVar1 = Curl_getaddrinfo_ex(*(char **)((long)arg + 8),local_24,(addrinfo *)((long)arg + 0x48),
                              (Curl_addrinfo **)((long)arg + 0x40));
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    if (*piVar2 != 0) {
      iVar1 = *piVar2;
    }
    *(int *)((long)arg + 0x98) = iVar1;
  }
  pthread_mutex_lock((pthread_mutex_t *)((long)arg + 0x10));
  if ((1 < *(int *)((long)arg + 0x9c)) && (*(int *)((long)arg + 0x3c) != -1)) {
    sVar3 = write(*(int *)((long)arg + 0x3c),&DAT_001762b8,8);
    if (sVar3 < 0) {
      piVar2 = __errno_location();
      *(int *)((long)arg + 0x98) = *piVar2;
    }
  }
  piVar2 = (int *)((long)arg + 0x9c);
  *piVar2 = *piVar2 + -1;
  iVar1 = *piVar2;
  pthread_mutex_unlock((pthread_mutex_t *)((long)arg + 0x10));
  if (iVar1 == 0) {
    addr_ctx_destroy((async_thrdd_addr_ctx *)arg);
  }
  return 0;
}

Assistant:

CURL_STDCALL getaddrinfo_thread(void *arg)
{
  struct async_thrdd_addr_ctx *addr_ctx = arg;
  char service[12];
  int rc;
  bool all_gone;

  msnprintf(service, sizeof(service), "%d", addr_ctx->port);

  rc = Curl_getaddrinfo_ex(addr_ctx->hostname, service,
                           &addr_ctx->hints, &addr_ctx->res);

  if(rc) {
    addr_ctx->sock_error = SOCKERRNO ? SOCKERRNO : rc;
    if(addr_ctx->sock_error == 0)
      addr_ctx->sock_error = RESOLVER_ENOMEM;
  }
  else {
    Curl_addrinfo_set_port(addr_ctx->res, addr_ctx->port);
  }

  Curl_mutex_acquire(&addr_ctx->mutx);
  if(addr_ctx->ref_count > 1) {
    /* Someone still waiting on our results. */
#ifndef CURL_DISABLE_SOCKETPAIR
    if(addr_ctx->sock_pair[1] != CURL_SOCKET_BAD) {
#ifdef USE_EVENTFD
      const uint64_t buf[1] = { 1 };
#else
      const char buf[1] = { 1 };
#endif
      /* DNS has been resolved, signal client task */
      if(wakeup_write(addr_ctx->sock_pair[1], buf, sizeof(buf)) < 0) {
        /* update sock_erro to errno */
        addr_ctx->sock_error = SOCKERRNO;
      }
    }
#endif
  }
  /* thread gives up its reference to the shared data now. */
  --addr_ctx->ref_count;
  all_gone = !addr_ctx->ref_count;
  Curl_mutex_release(&addr_ctx->mutx);
  if(all_gone)
    addr_ctx_destroy(addr_ctx);

  return 0;
}